

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O3

unique_ptr<benchmark::BenchmarkReporter,_std::default_delete<benchmark::BenchmarkReporter>_>
__thiscall
benchmark::internal::anon_unknown_7::CreateReporter
          (anon_unknown_7 *this,string *name,OutputOptions allow_color)

{
  int iVar1;
  BenchmarkReporter *this_00;
  undefined **ppuVar2;
  ostream *poVar3;
  
  iVar1 = std::__cxx11::string::compare((char *)name);
  if (iVar1 == 0) {
    this_00 = (BenchmarkReporter *)operator_new(0x28);
    BenchmarkReporter::BenchmarkReporter(this_00);
    ppuVar2 = &PTR_ReportContext_001418a0;
    this_00->_vptr_BenchmarkReporter = (_func_int **)&PTR_ReportContext_001418a0;
    *(bool *)&this_00[1].output_stream_ = allow_color == OO_Color;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)name);
    if (iVar1 == 0) {
      this_00 = (BenchmarkReporter *)operator_new(0x20);
      BenchmarkReporter::BenchmarkReporter(this_00);
      ppuVar2 = &PTR_ReportContext_00141948;
      this_00->_vptr_BenchmarkReporter = (_func_int **)&PTR_ReportContext_00141948;
      *(undefined1 *)&this_00[1]._vptr_BenchmarkReporter = 1;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)name);
      if (iVar1 != 0) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Unexpected format: \'");
        poVar3 = std::operator<<(poVar3,(string *)name);
        std::operator<<(poVar3,"\'\n");
        exit(1);
      }
      this_00 = (BenchmarkReporter *)operator_new(0x18);
      BenchmarkReporter::BenchmarkReporter(this_00);
      ppuVar2 = &PTR_ReportContext_001418f8;
      this_00->_vptr_BenchmarkReporter = (_func_int **)&PTR_ReportContext_001418f8;
    }
  }
  *(BenchmarkReporter **)this = this_00;
  return (unique_ptr<benchmark::BenchmarkReporter,_std::default_delete<benchmark::BenchmarkReporter>_>
          )ppuVar2;
}

Assistant:

std::unique_ptr<BenchmarkReporter>
CreateReporter(std::string const& name, ConsoleReporter::OutputOptions allow_color) {
  typedef std::unique_ptr<BenchmarkReporter> PtrType;
  if (name == "console") {
    return PtrType(new ConsoleReporter(allow_color));
  } else if (name == "json") {
    return PtrType(new JSONReporter);
  } else if (name == "csv") {
    return PtrType(new CSVReporter);
  } else {
    std::cerr << "Unexpected format: '" << name << "'\n";
    std::exit(1);
  }
}